

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall cmCMakePresetsGraph::TestPreset::~TestPreset(TestPreset *this)

{
  TestPreset *this_local;
  
  ~TestPreset(this);
  operator_delete(this,0x388);
  return;
}

Assistant:

~TestPreset() override = default;